

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void __thiscall
Reader::parseexpression
          (Reader *this,iterator *it,iterator end,shared_ptr<Expression> *expr,bool isobj)

{
  ProcessedTokenType PVar1;
  element_type *peVar2;
  ProcessedToken *pPVar3;
  LinTerm *pLVar4;
  QuadTerm *pQVar5;
  ProcessedToken *pPVar6;
  ProcessedToken *pPVar7;
  Builder *name_00;
  ProcessedToken *pPVar8;
  shared_ptr<QuadTerm> quadterm_2;
  shared_ptr<LinTerm> linterm;
  string name;
  
  pPVar3 = it->_M_current;
  if ((pPVar3 != end._M_current) && (pPVar3->type == CONID)) {
    std::__cxx11::string::assign
              ((char *)&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                        ->name);
    pPVar3 = it->_M_current + 1;
    it->_M_current = pPVar3;
  }
  name_00 = &this->builder;
  do {
    if (pPVar3 == end._M_current) {
      return;
    }
    pPVar6 = pPVar3 + 1;
    PVar1 = pPVar3->type;
    if (PVar1 == CONST && pPVar6 != end._M_current) {
      if (pPVar6->type == VARID) {
        std::__cxx11::string::string((string *)&name,pPVar3[1].field_1.name,(allocator *)&linterm);
        pLVar4 = (LinTerm *)operator_new(0x18);
        (pLVar4->var).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pLVar4->var).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pLVar4->coef = 1.0;
        std::__shared_ptr<LinTerm,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<LinTerm,void>
                  ((__shared_ptr<LinTerm,(__gnu_cxx::_Lock_policy)2> *)&linterm,pLVar4);
        (linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef =
             (double)it->_M_current->field_1;
        Builder::getvarbyname((Builder *)&quadterm_2,(string *)name_00);
        std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                   linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)&quadterm_2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>::push_back
                  (&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    linterms,&linterm);
        it->_M_current = it->_M_current + 2;
LAB_0020fd05:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&name);
      }
      else {
LAB_0020fc62:
        peVar2 = (expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar2->offset = (pPVar3->field_1).value + peVar2->offset;
        it->_M_current = pPVar3 + 1;
      }
    }
    else {
      if (PVar1 == VARID) {
        std::__cxx11::string::string((string *)&name,(pPVar3->field_1).name,(allocator *)&linterm);
        pLVar4 = (LinTerm *)operator_new(0x18);
        (pLVar4->var).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pLVar4->var).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pLVar4->coef = 1.0;
        std::__shared_ptr<LinTerm,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<LinTerm,void>
                  ((__shared_ptr<LinTerm,(__gnu_cxx::_Lock_policy)2> *)&linterm,pLVar4);
        (linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef = 1.0;
        Builder::getvarbyname((Builder *)&quadterm_2,(string *)name_00);
        std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                   linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)&quadterm_2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>::push_back
                  (&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    linterms,&linterm);
        it->_M_current = it->_M_current + 1;
        goto LAB_0020fd05;
      }
      if (PVar1 == CONST) goto LAB_0020fc62;
      if (pPVar6 == end._M_current) {
        return;
      }
      if (PVar1 != BRKOP) {
        return;
      }
      it->_M_current = pPVar6;
      while ((pPVar6 != end._M_current && (PVar1 = pPVar6->type, PVar1 != BRKCL))) {
        pPVar3 = pPVar6 + 1;
        pPVar7 = pPVar6 + 2;
        if (pPVar3 == end._M_current) {
          pPVar7 = pPVar3;
        }
        pPVar8 = pPVar7 + (pPVar7 != end._M_current);
        if ((((PVar1 == CONST && pPVar8 != end._M_current) && (pPVar3->type == VARID)) &&
            (pPVar7->type == HAT)) && (pPVar8->type == CONST)) {
          std::__cxx11::string::string((string *)&name,pPVar6[1].field_1.name,(allocator *)&linterm)
          ;
          lpassert((bool)(-((pPVar8->field_1).value == 2.0) & 1));
          pQVar5 = (QuadTerm *)operator_new(0x28);
          (pQVar5->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pQVar5->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (pQVar5->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pQVar5->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pQVar5->coef = 1.0;
          std::__shared_ptr<QuadTerm,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<QuadTerm,void>
                    ((__shared_ptr<QuadTerm,(__gnu_cxx::_Lock_policy)2> *)&linterm,pQVar5);
          linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].var.
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)it->_M_current->field_1;
          Builder::getvarbyname((Builder *)&quadterm_2,(string *)name_00);
          std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                     linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)&quadterm_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Builder::getvarbyname((Builder *)&quadterm_2,(string *)name_00);
          std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                     &(linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef
                     ,(__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)&quadterm_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
          push_back(&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     quadterms,(value_type *)&linterm);
          pPVar8 = pPVar8 + 1;
LAB_0020ff84:
          it->_M_current = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        else {
          if (((PVar1 == VARID && pPVar7 != end._M_current) && (pPVar3->type == HAT)) &&
             (pPVar7->type == CONST)) {
            std::__cxx11::string::string
                      ((string *)&name,(pPVar6->field_1).name,(allocator *)&linterm);
            lpassert((bool)(-((pPVar7->field_1).value == 2.0) & 1));
            pQVar5 = (QuadTerm *)operator_new(0x28);
            (pQVar5->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pQVar5->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (pQVar5->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pQVar5->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pQVar5->coef = 1.0;
            std::__shared_ptr<QuadTerm,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<QuadTerm,void>
                      ((__shared_ptr<QuadTerm,(__gnu_cxx::_Lock_policy)2> *)&linterm,pQVar5);
            linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].var.
            super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
            Builder::getvarbyname((Builder *)&quadterm_2,(string *)name_00);
            std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                       linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)&quadterm_2);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            Builder::getvarbyname((Builder *)&quadterm_2,(string *)name_00);
            std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                       &(linterm.super___shared_ptr<LinTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        coef,(__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)&quadterm_2);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
            push_back(&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                       quadterms,(value_type *)&linterm);
            goto LAB_0020ff84;
          }
          if (((PVar1 == CONST && pPVar8 != end._M_current) && (pPVar3->type == VARID)) &&
             ((pPVar7->type == ASTERISK && (pPVar8->type == VARID)))) {
            std::__cxx11::string::string
                      ((string *)&name,pPVar6[1].field_1.name,(allocator *)&linterm);
            std::__cxx11::string::string
                      ((string *)&linterm,(pPVar8->field_1).name,(allocator *)&quadterm_2);
            pQVar5 = (QuadTerm *)operator_new(0x28);
            (pQVar5->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pQVar5->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (pQVar5->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pQVar5->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pQVar5->coef = 1.0;
            std::__shared_ptr<QuadTerm,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<QuadTerm,void>
                      ((__shared_ptr<QuadTerm,(__gnu_cxx::_Lock_policy)2> *)&quadterm_2,pQVar5);
            (quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef =
                 (double)it->_M_current->field_1;
            Builder::getvarbyname((Builder *)&stack0xffffffffffffffc0,(string *)name_00);
            std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                       quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                       &stack0xffffffffffffffc0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
            Builder::getvarbyname((Builder *)&stack0xffffffffffffffc0,(string *)name_00);
            std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&((quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                       &stack0xffffffffffffffc0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
            std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
            push_back(&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                       quadterms,&quadterm_2);
            pPVar8 = pPVar8 + 1;
          }
          else {
            if ((((pPVar7 == end._M_current) || (PVar1 != VARID)) || (pPVar3->type != ASTERISK)) ||
               (pPVar7->type != VARID)) break;
            std::__cxx11::string::string
                      ((string *)&name,(pPVar6->field_1).name,(allocator *)&linterm);
            std::__cxx11::string::string
                      ((string *)&linterm,(pPVar7->field_1).name,(allocator *)&quadterm_2);
            pQVar5 = (QuadTerm *)operator_new(0x28);
            (pQVar5->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pQVar5->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (pQVar5->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pQVar5->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pQVar5->coef = 1.0;
            std::__shared_ptr<QuadTerm,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<QuadTerm,void>
                      ((__shared_ptr<QuadTerm,(__gnu_cxx::_Lock_policy)2> *)&quadterm_2,pQVar5);
            (quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef = 1.0
            ;
            Builder::getvarbyname((Builder *)&stack0xffffffffffffffc0,(string *)name_00);
            std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                       quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                       &stack0xffffffffffffffc0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
            Builder::getvarbyname((Builder *)&stack0xffffffffffffffc0,(string *)name_00);
            std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&((quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
                       &stack0xffffffffffffffc0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
            std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
            push_back(&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                       quadterms,&quadterm_2);
          }
          it->_M_current = pPVar8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&quadterm_2.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&linterm);
        }
        std::__cxx11::string::~string((string *)&name);
        pPVar6 = it->_M_current;
      }
      if (isobj) {
        pPVar3 = pPVar6 + 1;
        pPVar7 = pPVar6 + 2;
        if (pPVar3 == end._M_current) {
          pPVar7 = pPVar3;
        }
        lpassert(pPVar7 != end._M_current);
        lpassert(it->_M_current->type == BRKCL);
        lpassert(pPVar6[1].type == SLASH);
        lpassert(pPVar6[(ulong)(pPVar3 != end._M_current) + 1].type == CONST);
        lpassert((bool)(-((pPVar7->field_1).value == 2.0) & 1));
        it->_M_current = pPVar7 + 1;
      }
      else {
        lpassert(pPVar6 != end._M_current);
        lpassert(it->_M_current->type == BRKCL);
        it->_M_current = it->_M_current + 1;
      }
    }
    pPVar3 = it->_M_current;
  } while( true );
}

Assistant:

void Reader::parseexpression(std::vector<ProcessedToken>::iterator& it,
                             std::vector<ProcessedToken>::iterator end,
                             std::shared_ptr<Expression> expr, bool isobj) {
  if (it != end && it->type == ProcessedTokenType::CONID) {
    expr->name = it->name;
    ++it;
  }

  while (it != end) {
    std::vector<ProcessedToken>::iterator next = it;
    ++next;
    // const var
    if (next != end && it->type == ProcessedTokenType::CONST &&
        next->type == ProcessedTokenType::VARID) {
      std::string name = next->name;

      std::shared_ptr<LinTerm> linterm =
          std::shared_ptr<LinTerm>(new LinTerm());
      linterm->coef = it->value;
      linterm->var = builder.getvarbyname(name);
      //	 printf("LpReader: Term   %+g %s\n", linterm->coef,
      //name.c_str());
      expr->linterms.push_back(linterm);

      ++it;
      ++it;
      continue;
    }

    // const
    if (it->type == ProcessedTokenType::CONST) {
      //      printf("LpReader: Offset change from %+g by %+g\n", expr->offset, it->value);
      expr->offset += it->value;
      ++it;
      continue;
    }

    // var
    if (it->type == ProcessedTokenType::VARID) {
      std::string name = it->name;

      std::shared_ptr<LinTerm> linterm =
          std::shared_ptr<LinTerm>(new LinTerm());
      linterm->coef = 1.0;
      linterm->var = builder.getvarbyname(name);
      //	 printf("LpReader: Term   %+g %s\n", linterm->coef,
      //name.c_str());
      expr->linterms.push_back(linterm);

      ++it;
      continue;
    }

    // quadratic expression
    if (next != end && it->type == ProcessedTokenType::BRKOP) {
      ++it;
      while (it != end && it->type != ProcessedTokenType::BRKCL) {
        // const var hat const
        std::vector<ProcessedToken>::iterator next1 = it;  // token after it
        std::vector<ProcessedToken>::iterator next2 = it;  // token 2nd-after it
        std::vector<ProcessedToken>::iterator next3 = it;  // token 3rd-after it
        ++next1;
        ++next2;
        ++next3;
        if (next1 != end) {
          ++next2;
          ++next3;
        }
        if (next2 != end) ++next3;

        if (next3 != end && it->type == ProcessedTokenType::CONST &&
            next1->type == ProcessedTokenType::VARID &&
            next2->type == ProcessedTokenType::HAT &&
            next3->type == ProcessedTokenType::CONST) {
          std::string name = next1->name;

          lpassert(next3->value == 2.0);

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = it->value;
          quadterm->var1 = builder.getvarbyname(name);
          quadterm->var2 = builder.getvarbyname(name);
          expr->quadterms.push_back(quadterm);

          it = ++next3;
          continue;
        }

        // var hat const
        if (next2 != end && it->type == ProcessedTokenType::VARID &&
            next1->type == ProcessedTokenType::HAT &&
            next2->type == ProcessedTokenType::CONST) {
          std::string name = it->name;

          lpassert(next2->value == 2.0);

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = 1.0;
          quadterm->var1 = builder.getvarbyname(name);
          quadterm->var2 = builder.getvarbyname(name);
          expr->quadterms.push_back(quadterm);

          it = next3;
          continue;
        }

        // const var asterisk var
        if (next3 != end && it->type == ProcessedTokenType::CONST &&
            next1->type == ProcessedTokenType::VARID &&
            next2->type == ProcessedTokenType::ASTERISK &&
            next3->type == ProcessedTokenType::VARID) {
          std::string name1 = next1->name;
          std::string name2 = next3->name;

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = it->value;
          quadterm->var1 = builder.getvarbyname(name1);
          quadterm->var2 = builder.getvarbyname(name2);
          expr->quadterms.push_back(quadterm);

          it = ++next3;
          continue;
        }

        // var asterisk var
        if (next2 != end && it->type == ProcessedTokenType::VARID &&
            next1->type == ProcessedTokenType::ASTERISK &&
            next2->type == ProcessedTokenType::VARID) {
          std::string name1 = it->name;
          std::string name2 = next2->name;

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = 1.0;
          quadterm->var1 = builder.getvarbyname(name1);
          quadterm->var2 = builder.getvarbyname(name2);
          expr->quadterms.push_back(quadterm);

          it = next3;
          continue;
        }
        break;
      }
      if (isobj) {
        // only in the objective function, a quadratic term is followed by
        // "/2.0"
        std::vector<ProcessedToken>::iterator next1 = it;  // token after it
        std::vector<ProcessedToken>::iterator next2 = it;  // token 2nd-after it
        ++next1;
        ++next2;
        if (next1 != end) ++next2;

        lpassert(next2 != end);
        lpassert(it->type == ProcessedTokenType::BRKCL);
        lpassert(next1->type == ProcessedTokenType::SLASH);
        lpassert(next2->type == ProcessedTokenType::CONST);
        lpassert(next2->value == 2.0);
        it = ++next2;
      } else {
        lpassert(it != end);
        lpassert(it->type == ProcessedTokenType::BRKCL);
        ++it;
      }
      continue;
    }

    break;
  }
}